

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

Molecule * __thiscall
OpenMD::SelectionManager::beginUnselectedMolecule(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((**(byte **)&pOVar1[5].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) == 0) {
    *i = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = OpenMDBitSet::nextOffBit(pOVar1 + 5,0);
    *i = iVar2;
    if (iVar2 == -1) {
      return (Molecule *)0x0;
    }
  }
  return (this->molecules_).
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2];
}

Assistant:

Molecule* SelectionManager::beginUnselectedMolecule(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[MOLECULE].size())) {
      if (!ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) return molecules_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[MOLECULE].firstOffBit();
    return i == -1 ? NULL : molecules_[i];
#endif
  }